

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O1

int WebPWriteBMP(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  uint8_t zeroes [3];
  undefined2 local_9c;
  undefined1 local_9a;
  undefined2 local_98;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined1 uStack_8e;
  undefined2 uStack_8d;
  undefined1 uStack_8b;
  char cStack_8a;
  undefined1 uStack_89;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined2 uStack_7e;
  char cStack_7c;
  undefined1 uStack_7b;
  char cStack_7a;
  undefined1 uStack_79;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined6 uStack_60;
  undefined1 uStack_5a;
  undefined4 uStack_59;
  undefined2 uStack_55;
  undefined1 uStack_53;
  ulong local_48;
  long local_40;
  uint8_t *local_38;
  
  uStack_60 = 0;
  uStack_5a = 0;
  uStack_53 = 0;
  iVar6 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    uVar2 = buffer->colorspace - MODE_RGBA;
    if ((uVar2 < 0xc) && ((0x81dU >> (uVar2 & 0x1f) & 1) != 0)) {
      bVar11 = false;
    }
    else {
      bVar11 = buffer->colorspace - MODE_YUV < 0xfffffffc;
    }
    local_38 = (buffer->u).RGBA.rgba;
    iVar6 = 0;
    if (local_38 != (uint8_t *)0x0) {
      iVar7 = (uint)(bVar11 ^ 1) * 0x10;
      uVar8 = iVar7 + 0x36;
      iVar1 = buffer->width;
      uVar2 = buffer->height;
      uVar5 = (ulong)uVar2;
      local_40 = (long)(buffer->u).RGBA.stride;
      uVar9 = (4 - (uint)bVar11) * iVar1;
      uVar10 = uVar9 + 3 & 0xfffffffc;
      iVar4 = uVar10 * uVar2;
      local_98 = 0x4d42;
      iVar6 = iVar4 + uVar8;
      uStack_96 = (undefined1)iVar6;
      uStack_95 = (undefined1)((uint)iVar6 >> 8);
      uStack_94 = (undefined1)((uint)iVar6 >> 0x10);
      uStack_93 = (undefined1)((uint)iVar6 >> 0x18);
      uStack_92 = 0;
      uStack_90 = 0;
      uStack_8e = (undefined1)uVar8;
      iVar6 = 0;
      uStack_8d = 0;
      uStack_8b = 0;
      cStack_8a = (char)iVar7 + '(';
      uStack_89 = 0;
      uStack_88 = 0;
      uStack_87 = 0;
      uStack_86 = (undefined1)iVar1;
      uStack_85 = (undefined1)((uint)iVar1 >> 8);
      uStack_84 = (undefined1)((uint)iVar1 >> 0x10);
      uStack_83 = (undefined1)((uint)iVar1 >> 0x18);
      uStack_82 = (undefined1)uVar2;
      uStack_81 = (undefined1)(uVar2 >> 8);
      uStack_80 = (undefined1)(uVar2 >> 0x10);
      uStack_7f = (undefined1)(uVar2 >> 0x18);
      uStack_7e = 1;
      cStack_7c = (char)(4 - (uint)bVar11) << 3;
      uStack_7b = 0;
      cStack_7a = (bVar11 == false) * '\x03';
      uStack_79 = 0;
      local_78 = 0;
      uStack_77 = 0;
      uStack_76 = (undefined1)iVar4;
      uStack_75 = (undefined1)((uint)iVar4 >> 8);
      uStack_74 = (undefined1)((uint)iVar4 >> 0x10);
      uStack_73 = (undefined1)((uint)iVar4 >> 0x18);
      uStack_72 = 0x960;
      uStack_70 = 0;
      uStack_6e = 0x960;
      uStack_64 = 0;
      uStack_6c = 0;
      uStack_68 = 0;
      if (bVar11 == false) {
        uStack_60 = 0xff0000ff;
        uStack_5a = 0xff;
        uStack_53 = 0xff;
      }
      uStack_55 = 0;
      uStack_59 = 0;
      uStack_62 = 0;
      sVar3 = fwrite(&local_98,(ulong)uVar8,1,(FILE *)fout);
      if (sVar3 == 1) {
        if (uVar5 != 0) {
          local_48 = (ulong)(uVar10 - uVar9);
          do {
            sVar3 = fwrite(local_38 + (ulong)((int)uVar5 - 1) * local_40,(ulong)uVar9,1,(FILE *)fout
                          );
            if (sVar3 != 1) {
              return 0;
            }
            if (uVar10 != uVar9) {
              local_9a = 0;
              local_9c = 0;
              sVar3 = fwrite(&local_9c,local_48,1,(FILE *)fout);
              if (sVar3 != 1) {
                return 0;
              }
            }
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        iVar6 = 1;
      }
    }
  }
  return iVar6;
}

Assistant:

int WebPWriteBMP(FILE* fout, const WebPDecBuffer* const buffer) {
  int has_alpha, header_size;
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  uint32_t y;
  uint32_t bytes_per_px, line_size, image_size, bmp_stride, total_size;
  uint8_t bmp_header[BMP_HEADER_SIZE + BMP_HEADER_ALPHA_EXTRA_SIZE] = { 0 };

  if (fout == NULL || buffer == NULL) return 0;

  has_alpha = WebPIsAlphaMode(buffer->colorspace);
  header_size = BMP_HEADER_SIZE + (has_alpha ? BMP_HEADER_ALPHA_EXTRA_SIZE : 0);
  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;
  bytes_per_px = has_alpha ? 4 : 3;
  line_size = bytes_per_px * width;
  bmp_stride = (line_size + 3) & ~3;  // pad to 4
  image_size = bmp_stride * height;
  total_size = image_size + header_size;

  if (rgba == NULL) return 0;

  // bitmap file header
  PutLE16(bmp_header + 0, 0x4d42);                // signature 'BM'
  PutLE32(bmp_header + 2, total_size);            // size including header
  PutLE32(bmp_header + 6, 0);                     // reserved
  PutLE32(bmp_header + 10, header_size);          // offset to pixel array
  // bitmap info header
  PutLE32(bmp_header + 14, header_size - 14);     // DIB header size
  PutLE32(bmp_header + 18, width);                // dimensions
  PutLE32(bmp_header + 22, height);               // no vertical flip
  PutLE16(bmp_header + 26, 1);                    // number of planes
  PutLE16(bmp_header + 28, bytes_per_px * 8);     // bits per pixel
  PutLE32(bmp_header + 30, has_alpha ? 3 : 0);    // BI_BITFIELDS or BI_RGB
  PutLE32(bmp_header + 34, image_size);
  PutLE32(bmp_header + 38, 2400);                 // x pixels/meter
  PutLE32(bmp_header + 42, 2400);                 // y pixels/meter
  PutLE32(bmp_header + 46, 0);                    // number of palette colors
  PutLE32(bmp_header + 50, 0);                    // important color count
  if (has_alpha) {  // BITMAPV3INFOHEADER complement
    PutLE32(bmp_header + 54, 0x00ff0000);         // red mask
    PutLE32(bmp_header + 58, 0x0000ff00);         // green mask
    PutLE32(bmp_header + 62, 0x000000ff);         // blue mask
    PutLE32(bmp_header + 66, 0xff000000);         // alpha mask
  }

  // TODO(skal): color profile

  // write header
  if (fwrite(bmp_header, header_size, 1, fout) != 1) {
    return 0;
  }

  // write pixel array, bottom to top
  for (y = 0; y < height; ++y) {
    const uint8_t* const src = &rgba[(uint64_t)(height - 1 - y) * stride];
    if (fwrite(src, line_size, 1, fout) != 1) {
      return 0;
    }
    // write padding zeroes
    if (bmp_stride != line_size) {
      const uint8_t zeroes[3] = { 0 };
      if (fwrite(zeroes, bmp_stride - line_size, 1, fout) != 1) {
        return 0;
      }
    }
  }
  return 1;
}